

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying::~IfcStructuralLinearActionVarying
          (IfcStructuralLinearActionVarying *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralLinearActionVarying *this_local;
  
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
              super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
                                super_IfcStructuralActivity.super_IfcProduct.super_IfcObject + -0x18
                     )) = vtt[0x34];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x35];
  (this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x37];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.field_0x100 = vtt[0x38];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.field_0x138 = vtt[0x39];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x178 =
       vtt[0x3a];
  *(void **)&(this->super_IfcStructuralLinearAction).field_0x1a8 = vtt[0x3b];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::~ListOf
            (&this->SubsequentAppliedLoads);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying,_2UL> *)
             &(this->super_IfcStructuralLinearAction).field_0x1a8,vtt + 0x32);
  IfcStructuralLinearAction::~IfcStructuralLinearAction
            (&this->super_IfcStructuralLinearAction,vtt + 1);
  return;
}

Assistant:

IfcStructuralLinearActionVarying() : Object("IfcStructuralLinearActionVarying") {}